

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O0

void update_eob_context(int eob,TX_SIZE tx_size,TX_CLASS tx_class,PLANE_TYPE plane,
                       FRAME_CONTEXT *ec_ctx,uint8_t allow_update_cdf)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  byte in_CL;
  char in_DL;
  byte in_SIL;
  int in_EDI;
  long in_R8;
  char in_R9B;
  int bit;
  int eob_shift;
  int eob_ctx;
  int eob_multi_ctx;
  int eob_multi_size;
  TX_SIZE txs_ctx;
  int eob_pt;
  int eob_extra;
  uint local_18;
  char local_11;
  long local_10;
  byte local_7;
  char local_6;
  byte local_5;
  
  local_11 = in_R9B;
  local_10 = in_R8;
  local_7 = in_CL;
  local_6 = in_DL;
  local_5 = in_SIL;
  iVar3 = av1_get_eob_pos_token(in_EDI,(int *)&local_18);
  bVar2 = get_txsize_entropy_ctx(local_5);
  uVar4 = (uint)(local_6 != '\0');
  cVar1 = (char)iVar3;
  switch(""[local_5]) {
  case '\0':
    if (local_11 != '\0') {
      update_cdf((aom_cdf_prob *)(local_10 + 0x3c6 + (ulong)local_7 * 0x18 + (long)(int)uVar4 * 0xc)
                 ,cVar1 + -1,5);
    }
    break;
  case '\x01':
    if (local_11 != '\0') {
      update_cdf((aom_cdf_prob *)(local_10 + 0x3f6 + (ulong)local_7 * 0x1c + (long)(int)uVar4 * 0xe)
                 ,cVar1 + -1,6);
    }
    break;
  case '\x02':
    if (local_11 != '\0') {
      update_cdf((aom_cdf_prob *)
                 (local_10 + 0x42e + (ulong)local_7 * 0x20 + (long)(int)uVar4 * 0x10),cVar1 + -1,7);
    }
    break;
  case '\x03':
    if (local_11 != '\0') {
      update_cdf((aom_cdf_prob *)
                 (local_10 + 0x46e + (ulong)local_7 * 0x24 + (long)(int)uVar4 * 0x12),cVar1 + -1,8);
    }
    break;
  case '\x04':
    if (local_11 != '\0') {
      update_cdf((aom_cdf_prob *)
                 (local_10 + 0x4b6 + (ulong)local_7 * 0x28 + (long)(int)uVar4 * 0x14),cVar1 + -1,9);
    }
    break;
  case '\x05':
    if (local_11 != '\0') {
      update_cdf((aom_cdf_prob *)
                 (local_10 + 0x506 + (ulong)local_7 * 0x2c + (long)(int)uVar4 * 0x16),cVar1 + -1,10)
      ;
    }
    break;
  case '\x06':
  default:
    if (local_11 != '\0') {
      update_cdf((aom_cdf_prob *)
                 (local_10 + 0x55e + (ulong)local_7 * 0x30 + (long)(int)uVar4 * 0x18),cVar1 + -1,0xb
                );
    }
  }
  if (0 < av1_eob_offset_bits[iVar3]) {
    if (local_11 != '\0') {
      update_cdf((aom_cdf_prob *)
                 (local_10 + 0x186 + (ulong)bVar2 * 0x6c + (ulong)local_7 * 0x36 +
                 (long)(iVar3 + -3) * 6),
                 (local_18 & 1 << ((char)av1_eob_offset_bits[iVar3] - 1U & 0x1f)) != 0,2);
    }
  }
  return;
}

Assistant:

static void update_eob_context(int eob, TX_SIZE tx_size, TX_CLASS tx_class,
                               PLANE_TYPE plane, FRAME_CONTEXT *ec_ctx,
                               uint8_t allow_update_cdf) {
#endif
  int eob_extra;
  const int eob_pt = av1_get_eob_pos_token(eob, &eob_extra);
  TX_SIZE txs_ctx = get_txsize_entropy_ctx(tx_size);

  const int eob_multi_size = txsize_log2_minus4[tx_size];
  const int eob_multi_ctx = (tx_class == TX_CLASS_2D) ? 0 : 1;

  switch (eob_multi_size) {
    case 0:
#if CONFIG_ENTROPY_STATS
      ++counts->eob_multi16[cdf_idx][plane][eob_multi_ctx][eob_pt - 1];
#endif
      if (allow_update_cdf)
        update_cdf(ec_ctx->eob_flag_cdf16[plane][eob_multi_ctx], eob_pt - 1, 5);
      break;
    case 1:
#if CONFIG_ENTROPY_STATS
      ++counts->eob_multi32[cdf_idx][plane][eob_multi_ctx][eob_pt - 1];
#endif
      if (allow_update_cdf)
        update_cdf(ec_ctx->eob_flag_cdf32[plane][eob_multi_ctx], eob_pt - 1, 6);
      break;
    case 2:
#if CONFIG_ENTROPY_STATS
      ++counts->eob_multi64[cdf_idx][plane][eob_multi_ctx][eob_pt - 1];
#endif
      if (allow_update_cdf)
        update_cdf(ec_ctx->eob_flag_cdf64[plane][eob_multi_ctx], eob_pt - 1, 7);
      break;
    case 3:
#if CONFIG_ENTROPY_STATS
      ++counts->eob_multi128[cdf_idx][plane][eob_multi_ctx][eob_pt - 1];
#endif
      if (allow_update_cdf) {
        update_cdf(ec_ctx->eob_flag_cdf128[plane][eob_multi_ctx], eob_pt - 1,
                   8);
      }
      break;
    case 4:
#if CONFIG_ENTROPY_STATS
      ++counts->eob_multi256[cdf_idx][plane][eob_multi_ctx][eob_pt - 1];
#endif
      if (allow_update_cdf) {
        update_cdf(ec_ctx->eob_flag_cdf256[plane][eob_multi_ctx], eob_pt - 1,
                   9);
      }
      break;
    case 5:
#if CONFIG_ENTROPY_STATS
      ++counts->eob_multi512[cdf_idx][plane][eob_multi_ctx][eob_pt - 1];
#endif
      if (allow_update_cdf) {
        update_cdf(ec_ctx->eob_flag_cdf512[plane][eob_multi_ctx], eob_pt - 1,
                   10);
      }
      break;
    case 6:
    default:
#if CONFIG_ENTROPY_STATS
      ++counts->eob_multi1024[cdf_idx][plane][eob_multi_ctx][eob_pt - 1];
#endif
      if (allow_update_cdf) {
        update_cdf(ec_ctx->eob_flag_cdf1024[plane][eob_multi_ctx], eob_pt - 1,
                   11);
      }
      break;
  }

  if (av1_eob_offset_bits[eob_pt] > 0) {
    int eob_ctx = eob_pt - 3;
    int eob_shift = av1_eob_offset_bits[eob_pt] - 1;
    int bit = (eob_extra & (1 << eob_shift)) ? 1 : 0;
#if CONFIG_ENTROPY_STATS
    counts->eob_extra[cdf_idx][txs_ctx][plane][eob_pt][bit]++;
#endif  // CONFIG_ENTROPY_STATS
    if (allow_update_cdf)
      update_cdf(ec_ctx->eob_extra_cdf[txs_ctx][plane][eob_ctx], bit, 2);
  }
}